

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O2

vec3 __thiscall vera::Camera::worldToScreen(Camera *this,vec3 *_world,mat4 *_model)

{
  undefined8 extraout_XMM0_Qa;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 in_XMM1_Da;
  vec3 vVar1;
  
  (*(this->super_Node)._vptr_Node[0x45])();
  vVar1.field_1.y = (1.0 - (float)((ulong)extraout_XMM0_Qa >> 0x20)) * 0.5;
  vVar1.field_0.x = ((float)extraout_XMM0_Qa + 1.0) * 0.5;
  vVar1.field_2 = in_XMM1_Da;
  return vVar1;
}

Assistant:

glm::vec3 Camera::worldToScreen(const glm::vec3* _world, glm::mat4* _model) const { 
    glm::vec3 screen = worldToCamera(_world, _model);
    screen.x = (screen.x + 1.0f) * 0.5f;
    screen.y = (1.0f - screen.y) * 0.5f;
    // screen.x *= vera::getWindowWidth();
    // screen.y *= vera::getWindowHeight();
    return screen;
}